

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LogButtons(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImVector<int> *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 local_30;
  
  pIVar4 = GImGui;
  PushID("LogButtons");
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar6 = Button("Log To TTY",&local_30);
  pIVar5 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    (pIVar2->DC).CursorPos.x = (pIVar5->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
    (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
    (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
    (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
  }
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar7 = Button("Log To File",&local_30);
  pIVar5 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    (pIVar2->DC).CursorPos.x = (pIVar5->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
    (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
    (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
    (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
  }
  local_30.x = 0.0;
  local_30.y = 0.0;
  bVar8 = Button("Log To Clipboard",&local_30);
  pIVar5 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    (pIVar2->DC).CursorPos.x = (pIVar5->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
    (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
    (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
    (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
  }
  PushItemFlag(1,true);
  pIVar5 = GImGui;
  (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
  (pIVar5->NextItemData).Width = 80.0;
  SliderInt("Default Depth",&pIVar4->LogDepthToExpandDefault,0,9,(char *)0x0,0);
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar3 = &GImGui->ItemFlagsStack;
  iVar1 = (GImGui->ItemFlagsStack).Size;
  (GImGui->ItemFlagsStack).Size = iVar1 + -1;
  (pIVar2->DC).ItemFlags = pIVar3->Data[(long)iVar1 + -2];
  (pIVar2->IDStack).Size = (pIVar2->IDStack).Size + -1;
  if ((bVar6) && (pIVar4->LogEnabled == false)) {
    pIVar4->LogEnabled = true;
    pIVar4->LogType = ImGuiLogType_TTY;
    pIVar4->LogNextPrefix = (char *)0x0;
    pIVar4->LogNextSuffix = (char *)0x0;
    pIVar4->LogDepthRef = (pIVar2->DC).TreeDepth;
    pIVar4->LogDepthToExpand = pIVar4->LogDepthToExpandDefault;
    pIVar4->LogLinePosY = 3.4028235e+38;
    pIVar4->LogLineFirstItem = true;
    pIVar4->LogFile = _stdout;
  }
  if (bVar7) {
    LogToFile(-1,(char *)0x0);
  }
  pIVar4 = GImGui;
  if ((bVar8) && (GImGui->LogEnabled == false)) {
    pIVar2 = GImGui->CurrentWindow;
    GImGui->LogEnabled = true;
    pIVar4->LogType = ImGuiLogType_Clipboard;
    pIVar4->LogNextPrefix = (char *)0x0;
    pIVar4->LogNextSuffix = (char *)0x0;
    pIVar4->LogDepthRef = (pIVar2->DC).TreeDepth;
    pIVar4->LogDepthToExpand = pIVar4->LogDepthToExpandDefault;
    pIVar4->LogLinePosY = 3.4028235e+38;
    pIVar4->LogLineFirstItem = true;
  }
  return;
}

Assistant:

void ImGui::LogButtons()
{
    ImGuiContext& g = *GImGui;

    PushID("LogButtons");
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
    const bool log_to_tty = Button("Log To TTY"); SameLine();
#else
    const bool log_to_tty = false;
#endif
    const bool log_to_file = Button("Log To File"); SameLine();
    const bool log_to_clipboard = Button("Log To Clipboard"); SameLine();
    PushAllowKeyboardFocus(false);
    SetNextItemWidth(80.0f);
    SliderInt("Default Depth", &g.LogDepthToExpandDefault, 0, 9, NULL);
    PopAllowKeyboardFocus();
    PopID();

    // Start logging at the end of the function so that the buttons don't appear in the log
    if (log_to_tty)
        LogToTTY();
    if (log_to_file)
        LogToFile();
    if (log_to_clipboard)
        LogToClipboard();
}